

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrixEigenExtensions.h
# Opt level: O0

void __thiscall
Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
ArchiveOUT(MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           *this,ChArchiveOut *marchive)

{
  ChArchiveAsciiDump *pCVar1;
  ChStreamOutAscii *pCVar2;
  MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0> *pMVar3;
  Index IVar4;
  long lVar5;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
  *pDVar6;
  Scalar *pSVar7;
  Index IVar8;
  ulong uVar9;
  ChArchiveAsciiDump *local_110;
  ChNameValue<double> local_f8;
  ulong local_e0;
  size_t i_1;
  char idname [21];
  ChValueSpecific<double_*> specVal;
  double *foo;
  size_t tot_elements;
  ChNameValue<unsigned_long> local_50;
  unsigned_long local_38;
  size_t m_col;
  size_t m_row;
  int j;
  int i;
  ChArchiveAsciiDump *mascii;
  ChArchiveOut *marchive_local;
  MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  *this_local;
  
  mascii = (ChArchiveAsciiDump *)marchive;
  marchive_local = (ChArchiveOut *)this;
  chrono::ChArchiveOut::VersionWrite<chrono::ChMatrix_dense_version_tag>(marchive);
  if (mascii == (ChArchiveAsciiDump *)0x0) {
    local_110 = (ChArchiveAsciiDump *)0x0;
  }
  else {
    local_110 = (ChArchiveAsciiDump *)
                __dynamic_cast(mascii,&chrono::ChArchiveOut::typeinfo,
                               &chrono::ChArchiveAsciiDump::typeinfo);
  }
  _j = local_110;
  if (local_110 == (ChArchiveAsciiDump *)0x0) {
    pMVar3 = (MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              *)EigenBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ::derived((EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                           *)this);
    m_col = MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::rows(pMVar3);
    pMVar3 = (MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              *)EigenBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ::derived((EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                           *)this);
    local_38 = MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
               ::cols(pMVar3);
    pCVar1 = mascii;
    chrono::make_ChNameValue<unsigned_long>(&local_50,"rows",&m_col,'\0');
    chrono::ChArchiveOut::operator<<(&pCVar1->super_ChArchiveOut,&local_50);
    chrono::ChNameValue<unsigned_long>::~ChNameValue(&local_50);
    pCVar1 = mascii;
    chrono::make_ChNameValue<unsigned_long>
              ((ChNameValue<unsigned_long> *)&tot_elements,"columns",&local_38,'\0');
    chrono::ChArchiveOut::operator<<
              (&pCVar1->super_ChArchiveOut,(ChNameValue<unsigned_long> *)&tot_elements);
    chrono::ChNameValue<unsigned_long>::~ChNameValue((ChNameValue<unsigned_long> *)&tot_elements);
    pMVar3 = (MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              *)EigenBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ::derived((EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                           *)this);
    IVar4 = MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::rows(pMVar3);
    pMVar3 = (MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              *)EigenBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ::derived((EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                           *)this);
    IVar8 = MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::cols(pMVar3);
    uVar9 = IVar4 * IVar8;
    specVal._ptr_to_val = (double **)0x0;
    chrono::ChValueSpecific<double_*>::ChValueSpecific
              ((ChValueSpecific<double_*> *)(idname + 0x10),(double **)&specVal._ptr_to_val,"data",
               '\0');
    (*(mascii->super_ChArchiveOut).super_ChArchive._vptr_ChArchive[0xe])
              (mascii,(ChValueSpecific<double_*> *)(idname + 0x10),uVar9);
    for (local_e0 = 0; local_e0 < uVar9; local_e0 = local_e0 + 1) {
      sprintf((char *)&i_1,"%lu",local_e0);
      pCVar1 = mascii;
      pDVar6 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                *)EigenBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ::derived((EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                             *)this);
      pSVar7 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
               ::operator()(pDVar6,local_e0);
      chrono::make_ChNameValue<double>
                (&local_f8,"derived()((Eigen::Index)i)",pSVar7,(char *)&i_1,'\0');
      chrono::ChArchiveOut::operator<<(&pCVar1->super_ChArchiveOut,&local_f8);
      chrono::ChNameValue<double>::~ChNameValue(&local_f8);
      (*(mascii->super_ChArchiveOut).super_ChArchive._vptr_ChArchive[0xf])
                (mascii,idname + 0x10,uVar9);
    }
    (*(mascii->super_ChArchiveOut).super_ChArchive._vptr_ChArchive[0x10])
              (mascii,idname + 0x10,uVar9);
    chrono::ChValueSpecific<double_*>::~ChValueSpecific
              ((ChValueSpecific<double_*> *)(idname + 0x10));
  }
  else {
    chrono::ChArchiveAsciiDump::indent(local_110);
    pCVar2 = chrono::ChArchiveAsciiDump::GetStream(_j);
    pMVar3 = (MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              *)EigenBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ::derived((EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                           *)this);
    IVar4 = MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::rows(pMVar3);
    chrono::ChStreamOutAscii::operator<<(pCVar2,(int)IVar4);
    pCVar2 = chrono::ChArchiveAsciiDump::GetStream(_j);
    chrono::ChStreamOutAscii::operator<<(pCVar2," rows,  ");
    pCVar2 = chrono::ChArchiveAsciiDump::GetStream(_j);
    pMVar3 = (MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              *)EigenBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ::derived((EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                           *)this);
    IVar4 = MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::cols(pMVar3);
    chrono::ChStreamOutAscii::operator<<(pCVar2,(int)IVar4);
    pCVar2 = chrono::ChArchiveAsciiDump::GetStream(_j);
    chrono::ChStreamOutAscii::operator<<(pCVar2," columns:\n");
    m_row._4_4_ = 0;
    while( true ) {
      lVar5 = (long)m_row._4_4_;
      pMVar3 = (MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                *)EigenBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ::derived((EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                             *)this);
      IVar4 = MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              ::rows(pMVar3);
      if (IVar4 <= lVar5) break;
      chrono::ChArchiveAsciiDump::indent(_j);
      m_row._0_4_ = 0;
      while( true ) {
        lVar5 = (long)(int)m_row;
        pMVar3 = (MapBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                  *)EigenBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ::derived((EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                               *)this);
        IVar4 = MapBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                ::cols(pMVar3);
        if (IVar4 <= lVar5) break;
        pCVar2 = chrono::ChArchiveAsciiDump::GetStream(_j);
        pDVar6 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                  *)EigenBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ::derived((EigenBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                               *)this);
        pSVar7 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                 ::operator()(pDVar6,(long)m_row._4_4_,(long)(int)m_row);
        chrono::ChStreamOutAscii::operator<<(pCVar2,*pSVar7);
        pCVar2 = chrono::ChArchiveAsciiDump::GetStream(_j);
        chrono::ChStreamOutAscii::operator<<(pCVar2,", ");
        m_row._0_4_ = (int)m_row + 1;
      }
      pCVar2 = chrono::ChArchiveAsciiDump::GetStream(_j);
      chrono::ChStreamOutAscii::operator<<(pCVar2,"\n");
      m_row._4_4_ = m_row._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void ArchiveOUT(chrono::ChArchiveOut& marchive) {
    // suggested: use versioning
	marchive.VersionWrite<chrono::ChMatrix_dense_version_tag>(); // btw use the ChMatrixDynamic version tag also for all other templates.

    // stream out all member data

    if (chrono::ChArchiveAsciiDump* mascii = dynamic_cast<chrono::ChArchiveAsciiDump*>(&marchive)) {
        // CUSTOM row x col 'intuitive' table-like log when using ChArchiveAsciiDump:
        mascii->indent();
        mascii->GetStream()->operator<<((int)derived().rows());
        mascii->GetStream()->operator<<(" rows,  ");
        mascii->GetStream()->operator<<((int)derived().cols());
        mascii->GetStream()->operator<<(" columns:\n");
        for (int i = 0; i < derived().rows(); i++) {
            mascii->indent();
            for (int j = 0; j < derived().cols(); j++) {
                (*mascii->GetStream()) << derived()(i, j);
                mascii->GetStream()->operator<<(", ");
            }
            mascii->GetStream()->operator<<("\n");
        }
    } else {
        size_t m_row = derived().rows();
		size_t m_col = derived().cols();
        marchive << chrono::make_ChNameValue("rows", m_row);
        marchive << chrono::make_ChNameValue("columns", m_col);
         
        // NORMAL array-based serialization:
        size_t tot_elements = derived().rows() *  derived().cols();
		double* foo = 0;
        chrono::ChValueSpecific< double* > specVal(foo, "data", 0);
        marchive.out_array_pre(specVal, tot_elements);
		char idname[21]; // only for xml, xml serialization needs unique element name
        for (size_t i = 0; i < tot_elements; i++) {
			sprintf(idname, "%lu", (unsigned long)i);
            marchive << chrono::CHNVP(derived()((Eigen::Index)i), idname);
            marchive.out_array_between(specVal, tot_elements);
        }
        marchive.out_array_end(specVal, tot_elements);
    }
}